

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

size_t __thiscall choc::value::Type::Object::getValueDataSize(Object *this)

{
  size_t sVar1;
  size_t sVar2;
  MemberNameAndType *m;
  MemberNameAndType *pMVar3;
  long lVar4;
  
  pMVar3 = (this->members).items;
  sVar2 = 0;
  for (lVar4 = (ulong)(this->members).size * 0x30; lVar4 != 0; lVar4 = lVar4 + -0x30) {
    sVar1 = Type::getValueDataSize(&pMVar3->type);
    sVar2 = sVar2 + sVar1;
    pMVar3 = pMVar3 + 1;
  }
  return sVar2;
}

Assistant:

ObjectType* end() const                     { return items + size; }